

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ze_lib.cpp
# Opt level: O2

void __thiscall ze_lib::context_t::context_t(context_t *this)

{
  bool bVar1;
  
  this->initOnce = 0;
  this->initOnceDrivers = 0;
  (this->initOnceSysMan)._M_once = 0;
  (this->tracingLayerEnableCounter).super___atomic_base<unsigned_int>._M_i = 0;
  (this->zeDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zetDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zesDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zelTracingDdiTable).Tracer.pfnCreate = (zel_pfnTracerCreate_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnDestroy = (zel_pfnTracerDestroy_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnSetPrologues = (zel_pfnTracerSetPrologues_t)0x0;
  (this->pTracingZeDdiTable)._M_b._M_p = (__pointer_type)0x0;
  (this->zelTracingDdiTable).Tracer.pfnSetEpilogues = (zel_pfnTracerSetEpilogues_t)0x0;
  (this->zelTracingDdiTable).Tracer.pfnSetEnabled = (zel_pfnTracerSetEnabled_t)0x0;
  this->tracing_lib = (void *)0x0;
  this->isInitialized = false;
  this->zesInuse = false;
  this->zeInuse = false;
  this->debugTraceEnabled = false;
  this->dynamicTracingSupported = true;
  this->loaderDriverGet = (ze_pfnDriverGet_t)0x0;
  bVar1 = getenv_tobool("ZE_ENABLE_LOADER_DEBUG_TRACE");
  this->debugTraceEnabled = bVar1;
  return;
}

Assistant:

__zedlllocal context_t::context_t()
    {
        debugTraceEnabled = getenv_tobool( "ZE_ENABLE_LOADER_DEBUG_TRACE" );
    }